

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int bc_get_leb128(BCReaderState *s,uint32_t *pval)

{
  uint uVar1;
  int iVar2;
  
  uVar1 = get_leb128(pval,s->ptr,s->buf_end);
  if ((int)uVar1 < 0) {
    bc_read_error_end(s);
    iVar2 = -1;
  }
  else {
    s->ptr = s->ptr + uVar1;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int bc_get_leb128(BCReaderState *s, uint32_t *pval)
{
    int ret;
    ret = get_leb128(pval, s->ptr, s->buf_end);
    if (unlikely(ret < 0))
        return bc_read_error_end(s);
    s->ptr += ret;
    return 0;
}